

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O1

void duckdb::ConstructSortKeyStruct
               (SortKeyVectorData *vector_data,SortKeyChunk chunk,SortKeyConstructInfo *info)

{
  data_t dVar1;
  unsafe_vector<idx_t> *puVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  pointer puVar5;
  data_ptr_t pdVar6;
  unsigned_long uVar7;
  pointer puVar8;
  SortKeyChunk chunk_00;
  ulong uVar9;
  data_t *pdVar10;
  type pSVar11;
  ulong uVar12;
  idx_t iVar13;
  unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true> *child
  ;
  pointer puVar14;
  undefined7 uStack_37;
  
  if (chunk.start < chunk.end) {
    puVar2 = info->offsets;
    iVar13 = chunk.start;
    do {
      uVar12 = iVar13;
      if (chunk.has_result_index != false) {
        uVar12 = chunk.result_index;
      }
      psVar3 = ((vector_data->format).sel)->sel_vector;
      uVar9 = iVar13;
      if (psVar3 != (sel_t *)0x0) {
        uVar9 = (ulong)psVar3[iVar13];
      }
      puVar4 = (vector_data->format).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      if ((puVar4 == (unsigned_long *)0x0) ||
         (pdVar10 = &vector_data->null_byte, (puVar4[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0)) {
        pdVar10 = &vector_data->valid_byte;
      }
      puVar5 = (puVar2->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = info->result_data[uVar12];
      dVar1 = *pdVar10;
      uVar7 = puVar5[uVar12];
      puVar5[uVar12] = uVar7 + 1;
      pdVar6[uVar7] = dVar1;
      if (chunk.has_result_index != false) {
        puVar14 = (vector_data->child_data).
                  super_vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar8 = (vector_data->child_data).
                 super_vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (puVar14 != puVar8) {
          do {
            pSVar11 = unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
                      ::operator*(puVar14);
            chunk_00._25_7_ = uStack_37;
            chunk_00.has_result_index = true;
            chunk_00.end = iVar13 + 1;
            chunk_00.start = iVar13;
            chunk_00.result_index = uVar12;
            ConstructSortKeyRecursive(pSVar11,chunk_00,info);
            puVar14 = puVar14 + 1;
          } while (puVar14 != puVar8);
        }
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 != chunk.end);
  }
  if (chunk.has_result_index == false) {
    puVar8 = (vector_data->child_data).
             super_vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar14 = (vector_data->child_data).
                   super_vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar14 != puVar8;
        puVar14 = puVar14 + 1) {
      pSVar11 = unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
                ::operator*(puVar14);
      ConstructSortKeyRecursive(pSVar11,chunk,info);
    }
  }
  return;
}

Assistant:

void ConstructSortKeyStruct(SortKeyVectorData &vector_data, SortKeyChunk chunk, SortKeyConstructInfo &info) {
	bool list_of_structs = chunk.has_result_index;
	// write the validity data of the struct
	auto &offsets = info.offsets;
	for (idx_t r = chunk.start; r < chunk.end; r++) {
		auto result_index = chunk.GetResultIndex(r);
		auto idx = vector_data.format.sel->get_index(r);
		auto &offset = offsets[result_index];
		auto result_ptr = info.result_data[result_index];
		if (!vector_data.format.validity.RowIsValid(idx)) {
			// NULL value - write the null byte and skip
			result_ptr[offset++] = vector_data.null_byte;
		} else {
			// valid value - write the validity byte
			result_ptr[offset++] = vector_data.valid_byte;
		}
		if (list_of_structs) {
			// for a list of structs we need to write the child data for every iteration
			// since the final layout needs to be
			// [struct1][struct2][...]
			for (auto &child : vector_data.child_data) {
				SortKeyChunk child_chunk(r, r + 1, result_index);
				ConstructSortKeyRecursive(*child, child_chunk, info);
			}
		}
	}
	if (!list_of_structs) {
		for (auto &child : vector_data.child_data) {
			ConstructSortKeyRecursive(*child, chunk, info);
		}
	}
}